

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O2

bool __thiscall
chrono::utils::ChParserOpenSim::parseForce
          (ChParserOpenSim *this,xml_node<char> *forceNode,ChSystem *system,
          shared_ptr<chrono::ChLoadContainer> *container)

{
  ChLoadContainer *pCVar1;
  ChVector<double> *pCVar2;
  __type_conflict _Var3;
  bool bVar4;
  bool bVar5;
  xml_attribute<char> *pxVar6;
  ostream *poVar7;
  xml_node<char> *pxVar8;
  char *c_str;
  char *c_str_00;
  char *c_str_01;
  char *c_str_02;
  char *c_str_03;
  char *c_str_04;
  char *c_str_05;
  ChParserOpenSim *pCVar9;
  char *pcVar10;
  double dVar11;
  allocator local_199;
  shared_ptr<chrono::ChLoadBodyForce> load;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
  local_188;
  shared_ptr<chrono::ChBody> body;
  undefined1 local_120 [48];
  element_type *local_f0;
  string name;
  ChVector<double> direction;
  ChVector<double> point;
  __shared_ptr<chrono::ChLoadBase,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<chrono::ChLoadBase,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  pCVar9 = (ChParserOpenSim *)(forceNode->super_xml_base<char>).m_name;
  if (pCVar9 == (ChParserOpenSim *)0x0) {
    pCVar9 = (ChParserOpenSim *)&rapidxml::xml_base<char>::nullstr()::zero;
  }
  local_f0 = (element_type *)container;
  stringStripCStr_abi_cxx11_(&local_188.first,pCVar9,(char *)system);
  std::__cxx11::string::string((string *)local_120,"PointActuator",(allocator *)&name);
  _Var3 = std::operator==(&local_188.first,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_120);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)&local_188);
  if (_Var3) {
    pxVar6 = rapidxml::xml_node<char>::first_attribute(forceNode,"name",0,true);
    pCVar9 = (ChParserOpenSim *)(pxVar6->super_xml_base<char>).m_value;
    if (pCVar9 == (ChParserOpenSim *)0x0) {
      pCVar9 = (ChParserOpenSim *)&rapidxml::xml_base<char>::nullstr()::zero;
    }
    stringStripCStr_abi_cxx11_(&name,pCVar9,c_str_00);
    poVar7 = std::operator<<((ostream *)&std::cout,"Actuator ");
    poVar7 = std::operator<<(poVar7,(string *)&name);
    std::endl<char,std::char_traits<char>>(poVar7);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"body",0,true);
    pCVar9 = (ChParserOpenSim *)(pxVar8->super_xml_base<char>).m_value;
    if (pCVar9 == (ChParserOpenSim *)0x0) {
      pCVar9 = (ChParserOpenSim *)&rapidxml::xml_base<char>::nullstr()::zero;
    }
    stringStripCStr_abi_cxx11_(&local_188.first,pCVar9,c_str_01);
    ChAssembly::SearchBody((ChAssembly *)&body,(char *)&system->assembly);
    std::__cxx11::string::~string((string *)&local_188);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"point",0,true);
    pcVar10 = (pxVar8->super_xml_base<char>).m_value;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    strToChVector<double>(&point,pcVar10);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"point_is_global",0,true);
    pcVar10 = (pxVar8->super_xml_base<char>).m_value;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    bVar4 = CStrToBool(pcVar10);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"direction",0,true);
    pcVar10 = (pxVar8->super_xml_base<char>).m_value;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    strToChVector<double>(&direction,pcVar10);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"force_is_global",0,true);
    pcVar10 = (pxVar8->super_xml_base<char>).m_value;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    bVar5 = CStrToBool(pcVar10);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"optimal_force",0,true);
    pCVar9 = (ChParserOpenSim *)(pxVar8->super_xml_base<char>).m_value;
    if (pCVar9 == (ChParserOpenSim *)0x0) {
      pCVar9 = (ChParserOpenSim *)&rapidxml::xml_base<char>::nullstr()::zero;
    }
    stringStripCStr_abi_cxx11_(&local_188.first,pCVar9,c_str_02);
    dVar11 = std::__cxx11::stod(&local_188.first,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_188);
    local_199 = (allocator)!bVar4;
    local_188.first.field_2._M_allocated_capacity = (size_type)(dVar11 * direction.m_data[2]);
    local_120[0] = !bVar5;
    local_188.first._M_dataplus._M_p = (pointer)(dVar11 * direction.m_data[0]);
    local_188.first._M_string_length = (size_type)(dVar11 * direction.m_data[1]);
    std::
    make_shared<chrono::ChLoadBodyForce,std::shared_ptr<chrono::ChBody>&,chrono::ChVector<double>,bool,chrono::ChVector<double>&,bool>
              ((shared_ptr<chrono::ChBody> *)&load,(ChVector<double> *)&body,(bool *)&local_188,
               (ChVector<double> *)local_120,(bool *)&point);
    if (this->m_activate_actuators == false) {
      local_120._0_4_ = 0;
      std::make_shared<chrono::ChFunction_Const,int>((int *)&local_188);
      local_48._M_ptr = (element_type *)local_188.first._M_dataplus._M_p;
      local_48._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.first._M_string_length;
      local_188.first._M_dataplus._M_p = (pointer)0x0;
      local_188.first._M_string_length = 0;
      std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_modulation).
                  super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188.first._M_string_length);
    }
    pCVar1 = ((__shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2> *)
             &local_f0->m_model)->_M_ptr;
    std::__shared_ptr<chrono::ChLoadBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadBodyForce,void>
              (local_68,&load.
                         super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>);
    ChLoadContainer::Add(pCVar1,(shared_ptr<chrono::ChLoadBase> *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__cxx11::string::string((string *)local_120,"PointActuator",&local_199);
    std::__shared_ptr<chrono::ChLoadBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadBodyForce,void>
              ((__shared_ptr<chrono::ChLoadBase,(__gnu_cxx::_Lock_policy)2> *)(local_120 + 0x20),
               &load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chrono::utils::ChParserOpenSim::Report::ForceInfo,_true>
              (&local_188,&name,(ForceInfo *)local_120);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,chrono::utils::ChParserOpenSim::Report::ForceInfo>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->m_report).forces,&local_188);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
    ::~pair(&local_188);
    Report::ForceInfo::~ForceInfo((ForceInfo *)local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pCVar2 = (ChVector<double> *)&body;
  }
  else {
    pCVar9 = (ChParserOpenSim *)(forceNode->super_xml_base<char>).m_name;
    if (pCVar9 == (ChParserOpenSim *)0x0) {
      pCVar9 = (ChParserOpenSim *)&rapidxml::xml_base<char>::nullstr()::zero;
    }
    stringStripCStr_abi_cxx11_(&local_188.first,pCVar9,c_str);
    std::__cxx11::string::string((string *)local_120,"TorqueActuator",(allocator *)&name);
    _Var3 = std::operator==(&local_188.first,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)&local_188);
    if (!_Var3) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Unknown actuator type: ");
      pcVar10 = (forceNode->super_xml_base<char>).m_name;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      poVar7 = std::operator<<(poVar7,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar7);
      return false;
    }
    pxVar6 = rapidxml::xml_node<char>::first_attribute(forceNode,"name",0,true);
    pCVar9 = (ChParserOpenSim *)(pxVar6->super_xml_base<char>).m_value;
    if (pCVar9 == (ChParserOpenSim *)0x0) {
      pCVar9 = (ChParserOpenSim *)&rapidxml::xml_base<char>::nullstr()::zero;
    }
    stringStripCStr_abi_cxx11_(&name,pCVar9,c_str_03);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"bodyA",0,true);
    pCVar9 = (ChParserOpenSim *)(pxVar8->super_xml_base<char>).m_value;
    if (pCVar9 == (ChParserOpenSim *)0x0) {
      pCVar9 = (ChParserOpenSim *)&rapidxml::xml_base<char>::nullstr()::zero;
    }
    stringStripCStr_abi_cxx11_(&local_188.first,pCVar9,c_str_04);
    ChAssembly::SearchBody((ChAssembly *)&direction,(char *)&system->assembly);
    std::__cxx11::string::~string((string *)&local_188);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"bodyB",0,true);
    pCVar9 = (ChParserOpenSim *)(pxVar8->super_xml_base<char>).m_value;
    if (pCVar9 == (ChParserOpenSim *)0x0) {
      pCVar9 = (ChParserOpenSim *)&rapidxml::xml_base<char>::nullstr()::zero;
    }
    stringStripCStr_abi_cxx11_(&local_188.first,pCVar9,c_str_05);
    ChAssembly::SearchBody((ChAssembly *)&body,(char *)&system->assembly);
    std::__cxx11::string::~string((string *)&local_188);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"torque_is_global",0,true);
    pcVar10 = (pxVar8->super_xml_base<char>).m_value;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    bVar4 = CStrToBool(pcVar10);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"axis",0,true);
    pcVar10 = (pxVar8->super_xml_base<char>).m_value;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    strToChVector<double>(&point,pcVar10);
    pxVar8 = rapidxml::xml_node<char>::first_node(forceNode,"optimal_force",0,true);
    pcVar10 = (pxVar8->super_xml_base<char>).m_value;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&local_188,pcVar10,(allocator *)local_120);
    dVar11 = std::__cxx11::stod(&local_188.first,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_188);
    local_188.first.field_2._M_allocated_capacity = (size_type)(dVar11 * point.m_data[2]);
    local_120[0] = !bVar4;
    local_188.first._M_dataplus._M_p = (pointer)(dVar11 * point.m_data[0]);
    local_188.first._M_string_length = (size_type)(dVar11 * point.m_data[1]);
    std::
    make_shared<chrono::ChLoadBodyBodyTorque,std::shared_ptr<chrono::ChBody>&,std::shared_ptr<chrono::ChBody>&,chrono::ChVector<double>,bool>
              ((shared_ptr<chrono::ChBody> *)&load,&body,&direction,(bool *)&local_188);
    if (this->m_activate_actuators == false) {
      local_120._0_4_ = 0;
      std::make_shared<chrono::ChFunction_Const,int>((int *)&local_188);
      local_58._M_ptr = (element_type *)local_188.first._M_dataplus._M_p;
      local_58._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.first._M_string_length;
      local_188.first._M_dataplus._M_p = (pointer)0x0;
      local_188.first._M_string_length = 0;
      std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
                 &load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr[5].super_ChLoadCustom.loadable.
                  super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188.first._M_string_length);
    }
    pCVar1 = ((__shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2> *)
             &local_f0->m_model)->_M_ptr;
    std::__shared_ptr<chrono::ChLoadBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadBodyBodyTorque,void>
              (local_78,(__shared_ptr<chrono::ChLoadBodyBodyTorque,_(__gnu_cxx::_Lock_policy)2> *)
                        &load);
    ChLoadContainer::Add(pCVar1,(shared_ptr<chrono::ChLoadBase> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    std::__cxx11::string::string((string *)local_120,"TorqueActuator",&local_199);
    std::__shared_ptr<chrono::ChLoadBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadBodyBodyTorque,void>
              ((__shared_ptr<chrono::ChLoadBase,(__gnu_cxx::_Lock_policy)2> *)(local_120 + 0x20),
               (__shared_ptr<chrono::ChLoadBodyBodyTorque,_(__gnu_cxx::_Lock_policy)2> *)&load);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chrono::utils::ChParserOpenSim::Report::ForceInfo,_true>
              (&local_188,&name,(ForceInfo *)local_120);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,chrono::utils::ChParserOpenSim::Report::ForceInfo>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->m_report).forces,&local_188);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
    ::~pair(&local_188);
    Report::ForceInfo::~ForceInfo((ForceInfo *)local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pCVar2 = &direction;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&((__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)pCVar2->m_data)->
              _M_refcount);
  std::__cxx11::string::~string((string *)&name);
  return true;
}

Assistant:

bool ChParserOpenSim::parseForce(rapidxml::xml_node<>* forceNode,
                                 ChSystem& system,
                                 std::shared_ptr<ChLoadContainer> container) {
    if (stringStripCStr(forceNode->name()) == std::string("PointActuator")) {
        std::string name = stringStripCStr(forceNode->first_attribute("name")->value());
        std::cout << "Actuator " << name << std::endl;
        // Chrono should be using std::string
        auto body = system.SearchBody(stringStripCStr(forceNode->first_node("body")->value()).c_str());
        ChVector<> point = strToChVector<double>(forceNode->first_node("point")->value());
        auto point_global = CStrToBool(forceNode->first_node("point_is_global")->value());
        ChVector<> direction = strToChVector<double>(forceNode->first_node("direction")->value());
        auto force_global = CStrToBool(forceNode->first_node("force_is_global")->value());
        auto max_force = std::stod(stringStripCStr(forceNode->first_node("optimal_force")->value()));

        auto load = chrono_types::make_shared<ChLoadBodyForce>(body, max_force * direction, !force_global, point, !point_global);
        if (!m_activate_actuators)
            load->SetModulationFunction(chrono_types::make_shared<ChFunction_Const>(0));
        container->Add(load);

        m_report.forces.insert(std::make_pair(name, Report::ForceInfo{std::string("PointActuator"), load}));

        return true;
    } else if (stringStripCStr(forceNode->name()) == std::string("TorqueActuator")) {
        std::string name = stringStripCStr(forceNode->first_attribute("name")->value());
        auto bodyA = system.SearchBody(stringStripCStr(forceNode->first_node("bodyA")->value()).c_str());
        auto bodyB = system.SearchBody(stringStripCStr(forceNode->first_node("bodyB")->value()).c_str());
        auto torque_is_global = CStrToBool(forceNode->first_node("torque_is_global")->value());
        ChVector<> axis = strToChVector<double>(forceNode->first_node("axis")->value());
        auto max_force = std::stod(forceNode->first_node("optimal_force")->value());

        // Note: OpenSim assumes the specified torque is applied to bodyA (with an equal and opposite
        // torque applied to bodyB).  In ChLoadBodyBodyTorque, the torque is applied to the 2nd body
        // passed in its constructor.
        auto load = chrono_types::make_shared<ChLoadBodyBodyTorque>(bodyB, bodyA, max_force * axis, !torque_is_global);
        if (!m_activate_actuators)
            load->SetModulationFunction(chrono_types::make_shared<ChFunction_Const>(0));
        container->Add(load);

        m_report.forces.insert(std::make_pair(name, Report::ForceInfo{std::string("TorqueActuator"), load}));

        return true;
    }

    std::cout << "Unknown actuator type: " << forceNode->name() << std::endl;
    return false;
}